

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O1

FRemapTable * __thiscall FRemapTable::operator=(FRemapTable *this,FRemapTable *o)

{
  if (o != this) {
    if (o->NumEntries != this->NumEntries) {
      Free(this);
    }
    if (this->Remap == (BYTE *)0x0) {
      Alloc(this,o->NumEntries);
    }
    this->Inactive = o->Inactive;
    memcpy(this->Remap,o->Remap,(long)this->NumEntries * 5);
  }
  return this;
}

Assistant:

FRemapTable &FRemapTable::operator=(const FRemapTable &o)
{
	if (&o == this)
	{
		return *this;
	}
	if (o.NumEntries != NumEntries)
	{
		Free();
	}
	if (Remap == NULL)
	{
		Alloc(o.NumEntries);
	}
	Inactive = o.Inactive;
	memcpy(Remap, o.Remap, NumEntries*sizeof(*Remap) + NumEntries*sizeof(*Palette));
	return *this;
}